

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

document_iterator __thiscall llvm::yaml::Stream::begin(Stream *this)

{
  Document *this_00;
  Token local_50;
  
  if ((this->CurrentDoc)._M_t.
      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>._M_t.
      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>.
      super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl == (Document *)0x0) {
    Scanner::getNext(&local_50,
                     (this->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.Value._M_dataplus._M_p != &local_50.Value.field_2) {
      operator_delete(local_50.Value._M_dataplus._M_p,
                      local_50.Value.field_2._M_allocated_capacity + 1);
    }
    this_00 = (Document *)operator_new(0xa8);
    Document::Document(this_00,this);
    std::__uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::reset
              ((__uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
               &this->CurrentDoc,this_00);
    return (document_iterator)&this->CurrentDoc;
  }
  report_fatal_error("Can only iterate over the stream once",true);
}

Assistant:

document_iterator Stream::begin() {
  if (CurrentDoc)
    report_fatal_error("Can only iterate over the stream once");

  // Skip Stream-Start.
  scanner->getNext();

  CurrentDoc.reset(new Document(*this));
  return document_iterator(CurrentDoc);
}